

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ping-pong.cpp
# Opt level: O2

void __thiscall Wall::do_finish(Wall *this,actor_ref *param_1,msg_finish *param_2)

{
  char buffer [255];
  allocator<char> local_139;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  char local_118 [256];
  
  this->m_finished = true;
  snprintf(local_118,0xff,"Counter : %d",(ulong)(uint)this->m_counter);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,local_118,&local_139);
  acto::actor_ref::send<msg_out,std::__cxx11::string>(&this->m_console,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  acto::actor::die(&this->super_actor);
  return;
}

Assistant:

void do_finish(acto::actor_ref, const msg_finish&) {
    m_finished = true;
    // -
    char    buffer[255];

    std::snprintf(buffer, sizeof(buffer), "Counter : %d", (int)m_counter);
    // Отправить сообщение на консоль
    m_console.send< msg_out >(std::string(buffer));
    // Завершить выполнение текущего актера
    this->die();
  }